

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O2

string * format_abi_cxx11_(string *__return_storage_ptr__,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator_type local_129;
  va_list ap2;
  vector<char,_std::allocator<char>_> buf;
  va_list ap;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  ap2[0].reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  ap2[0].overflow_arg_area = &stack0x00000008;
  ap2[0].gp_offset = 0x10;
  ap2[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = ap2[0].overflow_arg_area;
  ap[0].reg_save_area = ap2[0].reg_save_area;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  uVar1 = vsnprintf((char *)0x0,0,fmt,ap);
  if (uVar1 < 0x7fffffff) {
    std::vector<char,_std::allocator<char>_>::vector(&buf,(ulong)(uVar1 + 1),&local_129);
    uVar2 = vsnprintf(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)(uVar1 + 1),fmt,ap2);
    if (uVar2 == uVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,
                 buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_start,
                 buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_start + uVar1);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buf.super__Vector_base<char,_std::allocator<char>_>);
      return __return_storage_ptr__;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-impl.cpp"
               ,0x5b,"GGML_ASSERT(%s) failed","size2 == size");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-impl.cpp"
             ,0x58,"GGML_ASSERT(%s) failed","size >= 0 && size < INT_MAX");
}

Assistant:

std::string format(const char * fmt, ...) {
    va_list ap;
    va_list ap2;
    va_start(ap, fmt);
    va_copy(ap2, ap);
    int size = vsnprintf(NULL, 0, fmt, ap);
    GGML_ASSERT(size >= 0 && size < INT_MAX); // NOLINT
    std::vector<char> buf(size + 1);
    int size2 = vsnprintf(buf.data(), size + 1, fmt, ap2);
    GGML_ASSERT(size2 == size);
    va_end(ap2);
    va_end(ap);
    return std::string(buf.data(), size);
}